

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSources::ProcessSDESPrivateItem
          (RTPSources *this,uint32_t ssrc,size_t prefixlen,void *prefixdata,size_t valuelen,
          void *valuedata,RTPTime *receivetime,RTPAddress *senderaddress)

{
  int iVar1;
  bool local_49;
  int status;
  bool created;
  RTPInternalSourceData *srcdat;
  void *valuedata_local;
  size_t valuelen_local;
  void *prefixdata_local;
  size_t prefixlen_local;
  RTPSources *pRStack_18;
  uint32_t ssrc_local;
  RTPSources *this_local;
  
  srcdat = (RTPInternalSourceData *)valuedata;
  valuedata_local = (void *)valuelen;
  valuelen_local = (size_t)prefixdata;
  prefixdata_local = (void *)prefixlen;
  prefixlen_local._4_4_ = ssrc;
  pRStack_18 = this;
  this_local._4_4_ =
       GetRTCPSourceData(this,ssrc,senderaddress,(RTPInternalSourceData **)&status,&local_49);
  if (-1 < this_local._4_4_) {
    if (_status == (RTPInternalSourceData *)0x0) {
      this_local._4_4_ = 0;
    }
    else {
      iVar1 = RTPInternalSourceData::ProcessPrivateSDESItem
                        (_status,(uint8_t *)valuelen_local,(size_t)prefixdata_local,
                         (uint8_t *)srcdat,(size_t)valuedata_local,receivetime);
      if ((local_49 & 1U) != 0) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[6])(this,_status);
      }
      this_local._4_4_ = iVar1;
      if (-1 < iVar1) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0xe])
                  (this,_status,valuelen_local,prefixdata_local,srcdat,valuedata_local);
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPSources::ProcessSDESPrivateItem(uint32_t ssrc,size_t prefixlen,const void *prefixdata,
                           size_t valuelen,const void *valuedata,const RTPTime &receivetime,
			   const RTPAddress *senderaddress)
{
	RTPInternalSourceData *srcdat;
	bool created;
	int status;
	
	status = GetRTCPSourceData(ssrc,senderaddress,&srcdat,&created);
	if (status < 0)
		return status;
	if (srcdat == 0)
		return 0;

	status = srcdat->ProcessPrivateSDESItem((const uint8_t *)prefixdata,prefixlen,(const uint8_t *)valuedata,valuelen,receivetime);
	// Call the callback
	if (created)
		OnNewSource(srcdat);

	if (status >= 0)
		OnRTCPSDESPrivateItem(srcdat, prefixdata, prefixlen, valuedata, valuelen);

	return status;
}